

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tty.c
# Opt level: O0

void tty_bind_char(EditLine *el,wchar_t force)

{
  el_action_t *map_00;
  el_action_t *map_01;
  el_action_t *local_60;
  el_action_t *dalt;
  el_action_t *dmap;
  el_action_t *alt;
  el_action_t *map;
  ttymap_t *tp;
  wchar_t old [2];
  wchar_t new [2];
  uchar *t_o;
  uchar *t_n;
  wchar_t force_local;
  EditLine *el_local;
  
  tp._4_4_ = 0;
  old[1] = L'\0';
  map_00 = (el->el_map).key;
  map_01 = (el->el_map).alt;
  if ((el->el_map).type == L'\x01') {
    dalt = (el->el_map).vii;
    local_60 = (el->el_map).vic;
  }
  else {
    dalt = (el->el_map).emacs;
    local_60 = (el_action_t *)0x0;
  }
  for (map = "\x02"; *(int *)map != -1; map = map + 0xc) {
    old[0] = (wchar_t)(el->el_tty).t_c[1][*(uint *)map];
    tp._0_4_ = (wchar_t)(el->el_tty).t_ed.c_cc[*(uint *)(map + 4)];
    if ((old[0] != (wchar_t)tp) || (force != L'\0')) {
      keymacro_clear(el,map_00,(wchar_t *)&tp);
      map_00[(uint)((wchar_t)tp & 0xff)] = dalt[(uint)((wchar_t)tp & 0xff)];
      keymacro_clear(el,map_00,old);
      map_00[(uint)(old[0] & 0xff)] = map[(long)(el->el_map).type + 8];
      if (local_60 != (el_action_t *)0x0) {
        keymacro_clear(el,map_01,(wchar_t *)&tp);
        map_01[(uint)((wchar_t)tp & 0xff)] = local_60[(uint)((wchar_t)tp & 0xff)];
        keymacro_clear(el,map_01,old);
        map_01[(uint)(old[0] & 0xff)] = map[(long)((el->el_map).type + L'\x01') + 8];
      }
    }
  }
  return;
}

Assistant:

libedit_private void
tty_bind_char(EditLine *el, int force)
{

	unsigned char *t_n = el->el_tty.t_c[ED_IO];
	unsigned char *t_o = el->el_tty.t_ed.c_cc;
	wchar_t new[2], old[2];
	const ttymap_t *tp;
	el_action_t *map, *alt;
	const el_action_t *dmap, *dalt;
	new[1] = old[1] = '\0';

	map = el->el_map.key;
	alt = el->el_map.alt;
	if (el->el_map.type == MAP_VI) {
		dmap = el->el_map.vii;
		dalt = el->el_map.vic;
	} else {
		dmap = el->el_map.emacs;
		dalt = NULL;
	}

	for (tp = tty_map; tp->nch != (wint_t)-1; tp++) {
		new[0] = (wchar_t)t_n[tp->nch];
		old[0] = (wchar_t)t_o[tp->och];
		if (new[0] == old[0] && !force)
			continue;
		/* Put the old default binding back, and set the new binding */
		keymacro_clear(el, map, old);
		map[(unsigned char)old[0]] = dmap[(unsigned char)old[0]];
		keymacro_clear(el, map, new);
		/* MAP_VI == 1, MAP_EMACS == 0... */
		map[(unsigned char)new[0]] = tp->bind[el->el_map.type];
		if (dalt) {
			keymacro_clear(el, alt, old);
			alt[(unsigned char)old[0]] =
			    dalt[(unsigned char)old[0]];
			keymacro_clear(el, alt, new);
			alt[(unsigned char)new[0]] =
			    tp->bind[el->el_map.type + 1];
		}
	}
}